

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_random.cpp
# Opt level: O0

void FRandom::StaticPrintSeeds(void)

{
  uint local_18;
  FRandom *pFStack_10;
  int idx;
  FRandom *rng;
  
  for (pFStack_10 = RNGList; pFStack_10 != (FRandom *)0x0; pFStack_10 = pFStack_10->Next) {
    if (pFStack_10->idx < 0x14) {
      local_18 = pFStack_10->idx;
    }
    else {
      local_18 = 0;
    }
    Printf("%s: %08x .. %d\n",pFStack_10->Name,
           (ulong)*(uint *)((long)&pFStack_10->sfmt + (long)(int)local_18 * 4),(ulong)local_18);
  }
  return;
}

Assistant:

void FRandom::StaticPrintSeeds ()
{
	FRandom *rng = RNGList;

	while (rng != NULL)
	{
		int idx = rng->idx < SFMT::N32 ? rng->idx : 0;
		Printf ("%s: %08x .. %d\n", rng->Name, rng->sfmt.u[idx], idx);
		rng = rng->Next;
	}
}